

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void encode_cache_cpuid4(CPUCacheInfo *cache,int num_apic_ids,int num_cores,uint32_t *eax,
                        uint32_t *ebx,uint32_t *ecx,uint32_t *edx)

{
  uint uVar1;
  uint uVar2;
  uint local_38;
  uint local_34;
  uint32_t *ecx_local;
  uint32_t *ebx_local;
  uint32_t *eax_local;
  int num_cores_local;
  int num_apic_ids_local;
  CPUCacheInfo *cache_local;
  
  if (cache->size !=
      (uint)cache->line_size * (uint)cache->associativity * (uint)cache->partitions * cache->sets) {
    __assert_fail("cache->size == cache->line_size * cache->associativity * cache->partitions * cache->sets"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xea,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (num_apic_ids < 1) {
    __assert_fail("num_apic_ids > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xec,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->type == DATA_CACHE) {
    local_34 = 1;
  }
  else {
    if (cache->type == INSTRUCTION_CACHE) {
      local_38 = 2;
    }
    else {
      local_38 = 0;
      if (cache->type == UNIFIED_CACHE) {
        local_38 = 3;
      }
    }
    local_34 = local_38;
  }
  uVar1 = 0;
  if ((cache->self_init & 1U) != 0) {
    uVar1 = 0x100;
  }
  *eax = local_34 | (uint)cache->level << 5 | uVar1 | (num_cores + -1) * 0x4000000 |
         (num_apic_ids + -1) * 0x4000;
  if (cache->line_size == 0) {
    __assert_fail("cache->line_size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xf3,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->partitions == '\0') {
    __assert_fail("cache->partitions > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xf4,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  if (cache->associativity != '\0') {
    if (cache->sets <= (uint)cache->associativity) {
      __assert_fail("cache->associativity < cache->sets",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                    ,0xf7,
                    "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                   );
    }
    *ebx = cache->line_size - 1 | (cache->partitions - 1) * 0x1000 |
           (cache->associativity - 1) * 0x400000;
    if (cache->sets != 0) {
      *ecx = cache->sets - 1;
      uVar1 = 0;
      if ((cache->inclusive & 1U) != 0) {
        uVar1 = 2;
      }
      uVar2 = 0;
      if ((cache->complex_indexing & 1U) != 0) {
        uVar2 = 4;
      }
      *edx = (cache->no_invd_sharing & 1U) != 0 | uVar1 | uVar2;
      return;
    }
    __assert_fail("cache->sets > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                  ,0xfc,
                  "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
                 );
  }
  __assert_fail("cache->associativity > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/i386/cpu.c"
                ,0xf5,
                "void encode_cache_cpuid4(CPUCacheInfo *, int, int, uint32_t *, uint32_t *, uint32_t *, uint32_t *)"
               );
}

Assistant:

static void encode_cache_cpuid4(CPUCacheInfo *cache,
                                int num_apic_ids, int num_cores,
                                uint32_t *eax, uint32_t *ebx,
                                uint32_t *ecx, uint32_t *edx)
{
    assert(cache->size == cache->line_size * cache->associativity *
                          cache->partitions * cache->sets);

    assert(num_apic_ids > 0);
    *eax = CACHE_TYPE(cache->type) |
           CACHE_LEVEL(cache->level) |
           (cache->self_init ? CACHE_SELF_INIT_LEVEL : 0) |
           ((num_cores - 1) << 26) |
           ((num_apic_ids - 1) << 14);

    assert(cache->line_size > 0);
    assert(cache->partitions > 0);
    assert(cache->associativity > 0);
    /* We don't implement fully-associative caches */
    assert(cache->associativity < cache->sets);
    *ebx = (cache->line_size - 1) |
           ((cache->partitions - 1) << 12) |
           ((cache->associativity - 1) << 22);

    assert(cache->sets > 0);
    *ecx = cache->sets - 1;

    *edx = (cache->no_invd_sharing ? CACHE_NO_INVD_SHARING : 0) |
           (cache->inclusive ? CACHE_INCLUSIVE : 0) |
           (cache->complex_indexing ? CACHE_COMPLEX_IDX : 0);
}